

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsSREF::reset(gdsSREF *this)

{
  gdsSREF *this_local;
  
  std::__cxx11::string::operator=((string *)&this->name,"");
  std::bitset<16UL>::reset(&this->sref_flags);
  this->reflection = false;
  this->angle = 0.0;
  this->scale = 1.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::__cxx11::string::operator=((string *)&this->propvalue,"");
  return;
}

Assistant:

void gdsSREF::reset()
{
  name = "\0";
  sref_flags.reset();
  reflection = false;
  angle = 0;
  scale = 1;
  xCor = 0;
  yCor = 0;
  propattr = 0;
  propvalue = "\0";
}